

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O3

void Fxch_ManComputeLevel(Fxch_Man_t *pFxchMan)

{
  uint *puVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  int *__s;
  uint uVar4;
  int iVar5;
  Vec_Wec_t *pVVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  
  pVVar6 = pFxchMan->vCubes;
  if (pVVar6->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  if (0 < pVVar6->pArray->nSize) {
    uVar4 = *pVVar6->pArray->pArray;
    iVar8 = pFxchMan->nVars;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    iVar5 = 0x10;
    if (0xe < iVar8 - 1U) {
      iVar5 = iVar8;
    }
    pVVar3->nCap = iVar5;
    if (iVar5 == 0) {
      pVVar3->pArray = (int *)0x0;
      pVVar3->nSize = iVar8;
    }
    else {
      __s = (int *)malloc((long)iVar5 << 2);
      pVVar3->pArray = __s;
      pVVar3->nSize = iVar8;
      if (__s != (int *)0x0) {
        memset(__s,0,(long)iVar8 << 2);
      }
    }
    pFxchMan->vLevels = pVVar3;
    lVar7 = 0;
    lVar9 = 0;
    iVar8 = 0;
    while (pVVar3 = pVVar6->pArray, 0 < *(int *)((long)&pVVar3->nSize + lVar7)) {
      puVar1 = *(uint **)((long)&pVVar3->pArray + lVar7);
      pVVar2 = pFxchMan->vLevels;
      if (uVar4 != *puVar1) {
        if (((int)uVar4 < 0) || (pVVar2->nSize <= (int)uVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        iVar5 = pVVar2->pArray[uVar4] - iVar8;
        iVar8 = (int)lVar9;
        pVVar2->pArray[uVar4] = iVar5 + iVar8;
        if (*(int *)((long)&pVVar3->nSize + lVar7) < 1) break;
        uVar4 = *puVar1;
      }
      iVar5 = Fxch_ManComputeLevelCube(pFxchMan,(Vec_Int_t *)((long)&pVVar3->nCap + lVar7));
      if (((int)uVar4 < 0) || (pVVar2->nSize <= (int)uVar4)) break;
      if (pVVar2->pArray[uVar4] < iVar5) {
        pVVar2->pArray[uVar4] = iVar5;
      }
      lVar9 = lVar9 + 1;
      pVVar6 = pFxchMan->vCubes;
      lVar7 = lVar7 + 0x10;
      if (pVVar6->nSize <= lVar9) {
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Fxch_ManComputeLevel( Fxch_Man_t* pFxchMan )
{
    Vec_Int_t* vCube;
    int i,
        iVar,
        iFirst = 0;

    iVar = Vec_IntEntry( Vec_WecEntry( pFxchMan->vCubes, 0 ), 0 );
    pFxchMan->vLevels = Vec_IntStart( pFxchMan->nVars );

    Vec_WecForEachLevel( pFxchMan->vCubes, vCube, i )
    {
        if ( iVar != Vec_IntEntry( vCube, 0 ) )
        {
            Vec_IntAddToEntry( pFxchMan->vLevels, iVar, i - iFirst );
            iVar = Vec_IntEntry( vCube, 0 );
            iFirst = i;
        }
        Vec_IntUpdateEntry( pFxchMan->vLevels, iVar, Fxch_ManComputeLevelCube( pFxchMan, vCube ) );
    }
}